

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::GPUShaderFP64Test10::logVariableType
          (GPUShaderFP64Test10 *this,GLvoid *buffer,GLchar *name,_variable_type type)

{
  ostringstream *this_00;
  _variable_type _Var1;
  uint uVar2;
  TestError *this_01;
  _variable_type type_00;
  long lVar3;
  double *value;
  string local_1d0;
  MessageBuilder message;
  
  _Var1 = Utils::getBaseVariableType(type);
  uVar2 = Utils::getNumberOfComponentsForVariableType(type);
  message.m_log = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = &message.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,name);
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>," (");
  Utils::getVariableTypeString_abi_cxx11_(&local_1d0,(Utils *)(ulong)type,type_00);
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,(string *)&local_1d0)
  ;
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,") [");
  std::__cxx11::string::~string((string *)&local_1d0);
  lVar3 = 0;
  value = (double *)buffer;
  do {
    if ((ulong)uVar2 << 2 == lVar3) {
      std::operator<<(&message.m_str.super_basic_ostream<char,_std::char_traits<char>_>,"]");
      tcu::MessageBuilder::operator<<(&message,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&message.m_str);
      return;
    }
    if (lVar3 != 0) {
      std::operator<<(&message.m_str.super_basic_ostream<char,_std::char_traits<char>_>,", ");
    }
    if (_Var1 == VARIABLE_TYPE_UINT) {
      tcu::MessageBuilder::operator<<(&message,(uint *)((long)buffer + lVar3));
    }
    else if (_Var1 == VARIABLE_TYPE_INT) {
      tcu::MessageBuilder::operator<<(&message,(int *)((long)buffer + lVar3));
    }
    else {
      if (_Var1 != VARIABLE_TYPE_DOUBLE) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Not implemented",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                   ,0x3952);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      tcu::MessageBuilder::operator<<(&message,value);
    }
    lVar3 = lVar3 + 4;
    value = value + 1;
  } while( true );
}

Assistant:

void GPUShaderFP64Test10::logVariableType(const glw::GLvoid* buffer, const glw::GLchar* name,
										  Utils::_variable_type type) const
{
	const Utils::_variable_type base_type	= Utils::getBaseVariableType(type);
	const glw::GLuint			n_components = Utils::getNumberOfComponentsForVariableType(type);
	tcu::MessageBuilder			message		 = m_context.getTestContext().getLog() << tcu::TestLog::Message;

	message << name << " (" << Utils::getVariableTypeString(type) << ") [";

	for (glw::GLuint component = 0; component < n_components; ++component)
	{
		if (0 != component)
		{
			message << ", ";
		}

		switch (base_type)
		{
		case Utils::VARIABLE_TYPE_DOUBLE:
			message << ((glw::GLdouble*)buffer)[component];
			break;
		case Utils::VARIABLE_TYPE_INT:
			message << ((glw::GLint*)buffer)[component];
			break;
		case Utils::VARIABLE_TYPE_UINT:
			message << ((glw::GLuint*)buffer)[component];
			break;
		default:
			TCU_FAIL("Not implemented");
		}
	}

	message << "]" << tcu::TestLog::EndMessage;
}